

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O3

TIdSentences * __thiscall
NJamSpell::TLangModel::ConvertToIds
          (TIdSentences *__return_storage_ptr__,TLangModel *this,TSentences *sentences)

{
  pointer pvVar1;
  ulong uVar2;
  pointer pTVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auStack_58 [8];
  TWordIds wordIds;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (sentences->
           super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((sentences->
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    uVar2 = 0;
    do {
      auStack_58 = (undefined1  [8])0x0;
      wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar3 = pvVar1[uVar2].super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar1[uVar2].super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_finish != pTVar3) {
        lVar5 = 0;
        uVar4 = 0;
        do {
          wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               GetWordId(this,(TWord *)((long)&pTVar3->Ptr + lVar5));
          if (wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                       (iterator)
                       wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (uint *)((long)&wordIds.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          }
          else {
            *wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start =
                 wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
            wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          uVar4 = uVar4 + 1;
          pTVar3 = pvVar1[uVar2].
                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x10;
        } while (uVar4 < (ulong)((long)pvVar1[uVar2].
                                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >>
                                4));
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)auStack_58);
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58);
      }
      uVar2 = uVar2 + 1;
      pvVar1 = (sentences->
               super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)(((long)(sentences->
                                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3)
                            * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

TIdSentences TLangModel::ConvertToIds(const TSentences& sentences) {
    TIdSentences newSentences;
    for (size_t i = 0; i < sentences.size(); ++i) {
        const TWords& words = sentences[i];
        TWordIds wordIds;
        for (size_t j = 0; j < words.size(); ++j) {
            const TWord& word = words[j];
            wordIds.push_back(GetWordId(word));
        }
        newSentences.push_back(wordIds);
    }
    return newSentences;
}